

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

void shk_chat(monst *shkp)

{
  short sVar1;
  int iVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  int *piVar8;
  char *pcVar9;
  char *line;
  long lVar10;
  
  if ((*(uint *)&shkp->field_0x60 >> 0x19 & 1) == 0) {
    pcVar6 = Monnam(shkp);
    pcVar9 = "%s asks whether you\'ve seen any untended shops recently.";
LAB_002427b4:
    pline(pcVar9,pcVar6);
    return;
  }
  if ((*(uint *)&shkp->field_0x60 >> 0x16 & 1) == 0) {
    iVar4 = pronoun_gender(level,shkp);
    pcVar6 = genders[iVar4].he;
    iVar4._0_1_ = shkp[0x1b].mtame;
    iVar4._1_1_ = shkp[0x1b].m_ap_type;
    iVar4._2_1_ = shkp[0x1b].mfrozen;
    iVar4._3_1_ = shkp[0x1b].mblinded;
    pcVar9 = "non-paying";
    if (iVar4 == 0) {
      pcVar9 = "rude";
    }
    line = "%s mentions how much %s dislikes %s customers.";
  }
  else {
    if (*(char *)((long)&shkp[0x1b].meating + 1) != '\0') {
      iVar4 = strncmp(&shkp[0x1b].field_0x75,plname,0x20);
      pcVar6 = Hello(shkp);
      if (iVar4 == 0) {
        verbalize("%s %s!  Didn\'t you forget to pay?",pcVar6,plname);
        return;
      }
      verbalize("%s %s!  I was looking for %s.",pcVar6,plname,&shkp[0x1b].field_0x75);
      *(undefined1 *)((long)&shkp[0x1b].meating + 1) = 0;
      return;
    }
    sVar1 = *(short *)((long)&shkp[0x1b].misc_worn_check + 2);
    iVar4 = (int)sVar1;
    if (sVar1 == 0) {
      if (*(int *)&shkp[0x1b].field_0x60 != 0) {
        iVar4 = pronoun_gender(level,shkp);
        pcVar6 = genders[iVar4].him;
        uVar5 = *(uint *)&shkp[0x1b].field_0x60;
        pcVar9 = currency((long)(int)uVar5);
        pline("%s reminds you that you owe %s %ld %s.",(undefined1 *)((long)&shkp[0x1c].minvent + 5)
              ,pcVar6,(ulong)uVar5,pcVar9);
        return;
      }
      uVar5 = shkp[0x1b].mappearance;
      if ((long)(int)uVar5 != 0) {
        pcVar6 = currency((long)(int)uVar5);
        pline("%s encourages you to use your %ld %s of credit.",
              (undefined1 *)((long)&shkp[0x1c].minvent + 5),(ulong)uVar5,pcVar6);
        return;
      }
      iVar2._0_1_ = shkp[0x1b].mtame;
      iVar2._1_1_ = shkp[0x1b].m_ap_type;
      iVar2._2_1_ = shkp[0x1b].mfrozen;
      iVar2._3_1_ = shkp[0x1b].mblinded;
      if (iVar2 == 0) {
        uVar7 = money_cnt(shkp->minvent);
        if (0x31 < (long)uVar7) {
          pcVar6 = (char *)((long)&shkp[0x1c].minvent + 5);
          if (uVar7 < 0xfa1) {
            iVar4 = strcmp(pcVar6,"Izchak");
            if (iVar4 == 0) {
              uVar5 = mt_random();
              pcVar9 = Izchak_speaks[uVar5 % 9];
            }
            else if (((urole.malenum == 0x159) && (iVar4 = inhishop(shkp), iVar4 != 0)) &&
                    (bVar3 = shk_has_leather_jackets((monst *)(ulong)(uint)shkp[0x1b].meating),
                    bVar3 != '\0')) {
              pcVar9 = "%s says that he\'s selling these fine leather jackets.";
            }
            else {
              pcVar9 = "%s talks about the problem of shoplifters.";
            }
          }
          else {
            pcVar9 = "%s says that business is good.";
          }
          goto LAB_002427b4;
        }
        pcVar9 = "%s complains that business is bad.";
      }
      else {
        pcVar9 = "%s complains about a recent robbery.";
      }
      pcVar6 = (char *)((long)&shkp[0x1c].minvent + 5);
      goto LAB_002427b4;
    }
    piVar8 = (int *)(*(long *)&shkp[0x1b].mnum + 0xc);
    lVar10 = 0;
    do {
      lVar10 = lVar10 + (long)*piVar8 * (long)piVar8[-1];
      piVar8 = piVar8 + 4;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    pcVar6 = (char *)(lVar10 + *(int *)&shkp[0x1b].field_0x60);
    pcVar9 = currency((long)pcVar6);
    line = "%s says that your bill comes to %ld %s.";
  }
  pline(line,(undefined1 *)((long)&shkp[0x1c].minvent + 5),pcVar6,pcVar9);
  return;
}

Assistant:

void shk_chat(struct monst *shkp)
{
	struct eshk *eshk;
	long shkmoney;
	if (!shkp->isshk) {
		/* The monster type is shopkeeper, but this monster is
		   not actually a shk, which could happen if someone
		   wishes for a shopkeeper statue and then animates it.
		   (Note: shkname() would be "" in a case like this.) */
		pline("%s asks whether you've seen any untended shops recently.",
		      Monnam(shkp));
		/* [Perhaps we ought to check whether this conversation
		   is taking place inside an untended shop, but a shopless
		   shk can probably be expected to be rather disoriented.] */
		return;
	}

	eshk = ESHK(shkp);
	if (ANGRY(shkp))
		pline("%s mentions how much %s dislikes %s customers.",
			shkname(shkp), mhe(level, shkp),
			eshk->robbed ? "non-paying" : "rude");
	else if (eshk->following) {
		if (strncmp(eshk->customer, plname, PL_NSIZ)) {
		    verbalize("%s %s!  I was looking for %s.",
			    Hello(shkp), plname, eshk->customer);
		    eshk->following = 0;
		} else {
		    verbalize("%s %s!  Didn't you forget to pay?",
			      Hello(shkp), plname);
		}
	} else if (eshk->billct) {
		long total = addupbill(shkp) + eshk->debit;
		pline("%s says that your bill comes to %ld %s.",
		      shkname(shkp), total, currency(total));
	} else if (eshk->debit)
		pline("%s reminds you that you owe %s %ld %s.",
		      shkname(shkp), mhim(level, shkp),
		      eshk->debit, currency(eshk->debit));
	else if (eshk->credit)
		pline("%s encourages you to use your %ld %s of credit.",
		      shkname(shkp), eshk->credit, currency(eshk->credit));
	else if (eshk->robbed)
		pline("%s complains about a recent robbery.", shkname(shkp));
	else if ((shkmoney = money_cnt(shkp->minvent)) < 50)
		pline("%s complains that business is bad.", shkname(shkp));
	else if (shkmoney > 4000)
		pline("%s says that business is good.", shkname(shkp));
	else if (strcmp(shkname(shkp), "Izchak") == 0)
		pline(Izchak_speaks[rn2(SIZE(Izchak_speaks))],shkname(shkp));
	else if (Role_if(PM_ARCHEOLOGIST) && inhishop(shkp) &&
		 shk_has_leather_jackets(shkp))
		pline("%s says that he's selling these fine leather jackets.",
		      shkname(shkp));
	else
		pline("%s talks about the problem of shoplifters.",shkname(shkp));
}